

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser_members.cpp
# Opt level: O0

PathDeclarationSyntax * __thiscall slang::parsing::Parser::parsePathDeclaration(Parser *this)

{
  span<slang::syntax::TokenOrSyntax,_18446744073709551615UL> elements;
  span<slang::syntax::TokenOrSyntax,_18446744073709551615UL> elements_00;
  span<slang::syntax::TokenOrSyntax,_18446744073709551615UL> elements_01;
  span<slang::syntax::TokenOrSyntax,_18446744073709551615UL> elements_02;
  Token polarityOperator;
  SourceRange range_00;
  Token openParen_00;
  Token edgeIdentifier;
  Token equals_00;
  Token openParen_01;
  Token colon_00;
  Token openParen_02;
  Token polarityOperator_00;
  Token closeParen_00;
  Token closeParen_01;
  Token pathOperator;
  Token semi_00;
  span<slang::syntax::TokenOrSyntax,_18446744073709551615UL> terminals;
  span<slang::syntax::TokenOrSyntax,_18446744073709551615UL> terminals_00;
  span<slang::syntax::TokenOrSyntax,_18446744073709551615UL> terminals_01;
  Token closeParen_02;
  bool bVar1;
  int iVar2;
  SeparatedSyntaxList<slang::syntax::NameSyntax> *outputs_00;
  PathDescriptionSyntax *pPVar3;
  undefined4 extraout_var;
  size_type sVar4;
  PathDeclarationSyntax *pPVar5;
  EVP_PKEY_CTX *src;
  Info *extraout_RDX;
  Info *in_RDI;
  Token TVar6;
  SourceRange range;
  element_type *lastDelay;
  SmallVector<slang::syntax::TokenOrSyntax,_4UL> buffer;
  span<slang::syntax::TokenOrSyntax,_18446744073709551615UL> delays;
  Token valueCloseParen;
  Token valueOpenParen;
  Token semi;
  Token equals;
  PathDescriptionSyntax *desc;
  Token closeParen;
  span<slang::syntax::TokenOrSyntax,_18446744073709551615UL> outputs_1;
  Token suffixCloseParen;
  ExpressionSyntax *expr;
  Token colon;
  Token polarity2;
  span<slang::syntax::TokenOrSyntax,_18446744073709551615UL> outputs;
  Token suffixOpenParen;
  PathSuffixSyntax *suffix;
  bool isFull;
  Token op;
  Token polarity;
  span<slang::syntax::TokenOrSyntax,_18446744073709551615UL> inputs;
  Token edge;
  Token openParen;
  anon_class_8_1_8991fb9c checkTerminals;
  anon_class_8_1_8991fb9c parsePolarity;
  ParserBase *in_stack_fffffffffffff998;
  uint32_t uVar7;
  ConstTokenOrSyntax *this_00;
  Parser *in_stack_fffffffffffff9a0;
  Token *this_01;
  SeparatedSyntaxList<slang::syntax::ExpressionSyntax> *this_02;
  undefined4 in_stack_fffffffffffff9a8;
  undefined4 uVar8;
  undefined2 in_stack_fffffffffffff9ac;
  undefined2 uVar9;
  TokenKind in_stack_fffffffffffff9ae;
  TokenKind kind;
  SourceLocation in_stack_fffffffffffff9b0;
  __extent_storage<18446744073709551615UL> this_03;
  undefined4 uVar10;
  undefined4 uVar11;
  ParserBase *in_stack_fffffffffffff9c0;
  undefined8 in_stack_fffffffffffff9c8;
  undefined4 in_stack_fffffffffffff9d0;
  DiagCode in_stack_fffffffffffff9d4;
  undefined8 in_stack_fffffffffffff9d8;
  Info *in_stack_fffffffffffff9e0;
  Info *in_stack_fffffffffffff9e8;
  SyntaxNode *in_stack_fffffffffffff9f0;
  undefined7 in_stack_fffffffffffff9f8;
  undefined1 in_stack_fffffffffffff9ff;
  ParserBase *in_stack_fffffffffffffa00;
  Info *pIVar12;
  SourceLocation in_stack_fffffffffffffa08;
  undefined4 in_stack_fffffffffffffa10;
  DiagCode in_stack_fffffffffffffa14;
  Info *suffix_00;
  undefined6 in_stack_fffffffffffffa18;
  TokenKind in_stack_fffffffffffffa1e;
  undefined8 in_stack_fffffffffffffa28;
  TokenKind kind_00;
  ParserBase *in_stack_fffffffffffffa30;
  Parser *in_stack_fffffffffffffaa0;
  RequireItems in_stack_fffffffffffffab4;
  Token *in_stack_fffffffffffffab8;
  TokenKind in_stack_fffffffffffffac4;
  TokenKind in_stack_fffffffffffffac6;
  SmallVectorBase<slang::syntax::TokenOrSyntax> *in_stack_fffffffffffffac8;
  ParserBase *in_stack_fffffffffffffad0;
  DiagCode in_stack_fffffffffffffae0;
  anon_class_8_1_8991fb9c *in_stack_fffffffffffffae8;
  AllowEmpty in_stack_fffffffffffffaf0;
  undefined1 local_4b8 [136];
  undefined1 in_stack_fffffffffffffbd0 [16];
  undefined4 in_stack_fffffffffffffbe8;
  undefined8 in_stack_fffffffffffffc00;
  undefined4 in_stack_fffffffffffffc08;
  undefined4 uStack_3f4;
  DiagCode in_stack_fffffffffffffc10;
  anon_class_8_1_8991fb9c *in_stack_fffffffffffffc18;
  SyntaxList<slang::syntax::AttributeInstanceSyntax> *in_stack_fffffffffffffc20;
  Info *local_3d8;
  SourceLocation local_320;
  SourceLocation local_318;
  SyntaxFactory *local_210;
  Info *local_208;
  Parser *local_1f0;
  Parser *local_1d0;
  EdgeSensitivePathSuffixSyntax *local_198;
  Token local_180;
  SourceLocation local_170;
  Token local_168;
  Token local_158;
  SourceLocation local_148;
  undefined4 local_13c;
  Token local_138;
  Token local_128;
  Token local_118;
  SourceLocation local_108;
  SourceLocation local_100;
  undefined4 local_f4;
  span<const_slang::parsing::Trivia,_18446744073709551615UL> local_f0;
  Token local_e0;
  SourceLocation local_d0;
  Token local_c8;
  SourceLocation local_b8;
  SourceLocation local_b0;
  undefined4 local_a4;
  Token local_a0;
  Token local_90;
  undefined1 local_79;
  undefined8 local_78;
  ParserBase *local_70;
  Token local_68;
  span<slang::syntax::TokenOrSyntax,_18446744073709551615UL> local_58;
  Token local_48;
  Token local_38;
  
  kind_00 = (TokenKind)((ulong)in_stack_fffffffffffffa28 >> 0x30);
  local_38 = ParserBase::expect(in_stack_fffffffffffffa30,kind_00);
  local_48 = parseEdgeKeyword((Parser *)in_stack_fffffffffffff9b0);
  local_58 = parsePathTerminals(in_stack_fffffffffffffaa0);
  local_68 = parsePathDeclaration::anon_class_8_1_8991fb9c::operator()
                       ((anon_class_8_1_8991fb9c *)in_stack_fffffffffffff9b0);
  Token::Token((Token *)in_stack_fffffffffffff9a0);
  local_79 = 0;
  bVar1 = Token::operator_cast_to_bool((Token *)0x31d6e5);
  local_210 = (SyntaxFactory *)in_stack_fffffffffffff9b0;
  if ((bVar1) ||
     ((bVar1 = ParserBase::peek((ParserBase *)in_stack_fffffffffffff9b0,in_stack_fffffffffffff9ae),
      local_210 = (SyntaxFactory *)in_stack_fffffffffffff9b0, !bVar1 &&
      (bVar1 = ParserBase::peek((ParserBase *)in_stack_fffffffffffff9b0,in_stack_fffffffffffff9ae),
      local_210 = (SyntaxFactory *)in_stack_fffffffffffff9b0, !bVar1)))) {
    local_118 = ParserBase::peek(in_stack_fffffffffffff998);
    in_stack_fffffffffffffa1e = local_118.kind;
    if (local_118.kind == StarArrow) {
      local_79 = 1;
      TVar6 = ParserBase::consume(in_stack_fffffffffffff9c0);
      local_128._0_8_ = TVar6._0_8_;
      local_78._0_2_ = local_128.kind;
      local_78._2_1_ = local_128._2_1_;
      local_78._3_1_ = local_128.numFlags.raw;
      local_78._4_4_ = local_128.rawLen;
      local_128.info = TVar6.info;
      local_70 = (ParserBase *)local_128.info;
      local_128 = TVar6;
    }
    else if (local_118.kind == EqualsArrow) {
      TVar6 = ParserBase::consume(in_stack_fffffffffffff9c0);
      local_138._0_8_ = TVar6._0_8_;
      local_78._0_2_ = local_138.kind;
      local_78._2_1_ = local_138._2_1_;
      local_78._3_1_ = local_138.numFlags.raw;
      local_78._4_4_ = local_138.rawLen;
      local_138.info = TVar6.info;
      local_70 = (ParserBase *)local_138.info;
      local_138 = TVar6;
    }
    else {
      local_13c = 0x4b0005;
      local_158 = ParserBase::peek(in_stack_fffffffffffff998);
      local_148 = Token::location(&local_158);
      ParserBase::addDiag(in_stack_fffffffffffffa00,in_stack_fffffffffffffa14,
                          in_stack_fffffffffffffa08);
      local_180 = ParserBase::peek(in_stack_fffffffffffff998);
      local_170 = Token::location(&local_180);
      TVar6 = ParserBase::missingToken
                        ((ParserBase *)
                         CONCAT26(in_stack_fffffffffffff9ae,
                                  CONCAT24(in_stack_fffffffffffff9ac,in_stack_fffffffffffff9a8)),
                         (TokenKind)((ulong)in_stack_fffffffffffff9a0 >> 0x30),
                         (SourceLocation)local_210);
      local_168._0_8_ = TVar6._0_8_;
      local_78._0_2_ = local_168.kind;
      local_78._2_1_ = local_168._2_1_;
      local_78._3_1_ = local_168.numFlags.raw;
      local_78._4_4_ = local_168.rawLen;
      local_168.info = TVar6.info;
      local_70 = (ParserBase *)local_168.info;
      local_168 = TVar6;
    }
  }
  else {
    local_90 = ParserBase::consume(in_stack_fffffffffffff9c0);
    local_68 = local_90;
    TVar6 = ParserBase::consumeIf
                      (&in_stack_fffffffffffff9a0->super_ParserBase,
                       (TokenKind)((ulong)in_stack_fffffffffffff998 >> 0x30));
    local_a0._0_8_ = TVar6._0_8_;
    local_78._0_2_ = local_a0.kind;
    local_78._2_1_ = local_a0._2_1_;
    local_78._3_1_ = local_a0.numFlags.raw;
    local_78._4_4_ = local_a0.rawLen;
    local_a0.info = TVar6.info;
    local_70 = (ParserBase *)local_a0.info;
    local_a0 = TVar6;
    bVar1 = Token::operator_cast_to_bool((Token *)0x31d7aa);
    if (bVar1) {
      local_f0 = Token::trivia((Token *)in_stack_fffffffffffff9c0);
      bVar1 = std::span<const_slang::parsing::Trivia,_18446744073709551615UL>::empty
                        ((span<const_slang::parsing::Trivia,_18446744073709551615UL> *)0x31d8b5);
      if (((bVar1 ^ 0xffU) & 1) != 0) {
        local_f4 = 0x4b0005;
        local_108 = Token::location(&local_68);
        local_100 = SourceLocation::operator+<int>
                              ((SourceLocation *)
                               CONCAT26(in_stack_fffffffffffff9ae,
                                        CONCAT24(in_stack_fffffffffffff9ac,in_stack_fffffffffffff9a8
                                                )),(int)((ulong)in_stack_fffffffffffff9a0 >> 0x20));
        ParserBase::addDiag(in_stack_fffffffffffffa00,in_stack_fffffffffffffa14,
                            in_stack_fffffffffffffa08);
      }
    }
    else {
      local_a4 = 0x4b0005;
      local_b8 = Token::location(&local_68);
      local_b0 = SourceLocation::operator+<int>
                           ((SourceLocation *)
                            CONCAT26(in_stack_fffffffffffff9ae,
                                     CONCAT24(in_stack_fffffffffffff9ac,in_stack_fffffffffffff9a8)),
                            (int)((ulong)in_stack_fffffffffffff9a0 >> 0x20));
      ParserBase::addDiag(in_stack_fffffffffffffa00,in_stack_fffffffffffffa14,
                          in_stack_fffffffffffffa08);
      local_e0 = ParserBase::peek(in_stack_fffffffffffff998);
      local_d0 = Token::location(&local_e0);
      TVar6 = ParserBase::missingToken
                        ((ParserBase *)
                         CONCAT26(in_stack_fffffffffffff9ae,
                                  CONCAT24(in_stack_fffffffffffff9ac,in_stack_fffffffffffff9a8)),
                         (TokenKind)((ulong)in_stack_fffffffffffff9a0 >> 0x30),
                         (SourceLocation)local_210);
      local_c8._0_8_ = TVar6._0_8_;
      local_78._0_2_ = local_c8.kind;
      local_78._2_1_ = local_c8._2_1_;
      local_78._3_1_ = local_c8.numFlags.raw;
      local_78._4_4_ = local_c8.rawLen;
      local_c8.info = TVar6.info;
      local_70 = (ParserBase *)local_c8.info;
      local_c8 = TVar6;
    }
  }
  terminals._M_extent._M_extent_value._0_4_ = in_stack_fffffffffffffa10;
  terminals._M_ptr = (pointer)in_stack_fffffffffffffa08;
  terminals._M_extent._M_extent_value._4_4_ = in_stack_fffffffffffffa14;
  parsePathDeclaration::anon_class_8_1_8991fb9c::operator()
            ((anon_class_8_1_8991fb9c *)in_stack_fffffffffffffa00,terminals,
             (bool)in_stack_fffffffffffff9ff);
  bVar1 = ParserBase::peek((ParserBase *)local_210,in_stack_fffffffffffff9ae);
  if (bVar1) {
    ParserBase::consume(in_stack_fffffffffffff9c0);
    parsePathTerminals(in_stack_fffffffffffffaa0);
    parsePathDeclaration::anon_class_8_1_8991fb9c::operator()((anon_class_8_1_8991fb9c *)local_210);
    Token::Token((Token *)in_stack_fffffffffffff9a0);
    bVar1 = Token::operator_cast_to_bool((Token *)0x31db9e);
    if ((bVar1) ||
       ((bVar1 = ParserBase::peek((ParserBase *)local_210,in_stack_fffffffffffff9ae), !bVar1 &&
        (bVar1 = ParserBase::peek((ParserBase *)local_210,in_stack_fffffffffffff9ae), !bVar1)))) {
      TVar6 = ParserBase::expect(in_stack_fffffffffffffa30,kind_00);
      local_1f0 = (Parser *)TVar6.info;
      local_1d0 = local_1f0;
    }
    else {
      ParserBase::consume(in_stack_fffffffffffff9c0);
    }
    outputs_00 = (SeparatedSyntaxList<slang::syntax::NameSyntax> *)
                 parseExpression(in_stack_fffffffffffff9a0);
    TVar6 = ParserBase::expect(in_stack_fffffffffffffa30,kind_00);
    suffix_00 = in_RDI + 0xe;
    elements._M_ptr._4_2_ = in_stack_fffffffffffff9ac;
    elements._M_ptr._0_4_ = in_stack_fffffffffffff9a8;
    elements._M_ptr._6_2_ = in_stack_fffffffffffff9ae;
    elements._M_extent._M_extent_value = (size_t)local_210;
    slang::syntax::SeparatedSyntaxList<slang::syntax::NameSyntax>::SeparatedSyntaxList
              ((SeparatedSyntaxList<slang::syntax::NameSyntax> *)in_stack_fffffffffffff9a0,elements)
    ;
    local_210 = TVar6._0_8_;
    local_208 = TVar6.info;
    in_stack_fffffffffffff9a8 = SUB84(outputs_00,0);
    in_stack_fffffffffffff9ac = (undefined2)((ulong)outputs_00 >> 0x20);
    in_stack_fffffffffffff9ae = (TokenKind)((ulong)outputs_00 >> 0x30);
    openParen_00.info._0_4_ = in_stack_fffffffffffff9d0;
    openParen_00.kind = (short)in_stack_fffffffffffff9c8;
    openParen_00._2_1_ = (char)((ulong)in_stack_fffffffffffff9c8 >> 0x10);
    openParen_00.numFlags.raw = (char)((ulong)in_stack_fffffffffffff9c8 >> 0x18);
    openParen_00.rawLen = (int)((ulong)in_stack_fffffffffffff9c8 >> 0x20);
    openParen_00.info._4_4_ = in_stack_fffffffffffff9d4;
    polarityOperator.info = (Info *)in_stack_fffffffffffff9c0;
    polarityOperator._0_8_ = local_208;
    colon_00.info = in_stack_fffffffffffff9e8;
    colon_00._0_8_ = in_stack_fffffffffffff9e0;
    closeParen_01.rawLen._3_1_ = in_stack_fffffffffffff9ff;
    closeParen_01._0_7_ = in_stack_fffffffffffff9f8;
    closeParen_01.info = (Info *)in_stack_fffffffffffffa00;
    local_198 = slang::syntax::SyntaxFactory::edgeSensitivePathSuffix
                          (local_210,openParen_00,outputs_00,polarityOperator,colon_00,
                           (ExpressionSyntax *)in_stack_fffffffffffff9f0,closeParen_01);
    terminals_00._M_extent._M_extent_value._0_4_ = (int)suffix_00;
    terminals_00._M_ptr = (pointer)in_stack_fffffffffffffa08;
    terminals_00._M_extent._M_extent_value._4_4_ = (int)((ulong)suffix_00 >> 0x20);
    parsePathDeclaration::anon_class_8_1_8991fb9c::operator()
              ((anon_class_8_1_8991fb9c *)in_stack_fffffffffffffa00,terminals_00,
               (bool)in_stack_fffffffffffff9ff);
  }
  else {
    parsePathTerminals(in_stack_fffffffffffffaa0);
    in_stack_fffffffffffffa08 = (SourceLocation)(in_RDI + 0xe);
    elements_00._M_ptr._4_2_ = in_stack_fffffffffffff9ac;
    elements_00._M_ptr._0_4_ = in_stack_fffffffffffff9a8;
    elements_00._M_ptr._6_2_ = in_stack_fffffffffffff9ae;
    elements_00._M_extent._M_extent_value = (size_t)local_210;
    slang::syntax::SeparatedSyntaxList<slang::syntax::NameSyntax>::SeparatedSyntaxList
              ((SeparatedSyntaxList<slang::syntax::NameSyntax> *)in_stack_fffffffffffff9a0,
               elements_00);
    local_198 = (EdgeSensitivePathSuffixSyntax *)
                slang::syntax::SyntaxFactory::simplePathSuffix
                          ((SyntaxFactory *)in_stack_fffffffffffff9a0,
                           (SeparatedSyntaxList<slang::syntax::NameSyntax> *)
                           in_stack_fffffffffffff998);
    terminals_01._M_extent._M_extent_value._0_4_ = in_stack_fffffffffffffa10;
    terminals_01._M_ptr = (pointer)in_stack_fffffffffffffa08;
    terminals_01._M_extent._M_extent_value._4_4_ = in_stack_fffffffffffffa14;
    parsePathDeclaration::anon_class_8_1_8991fb9c::operator()
              ((anon_class_8_1_8991fb9c *)in_stack_fffffffffffffa00,terminals_01,
               (bool)in_stack_fffffffffffff9ff);
    suffix_00 = (Info *)CONCAT44(in_stack_fffffffffffffa14,in_stack_fffffffffffffa10);
    local_1d0 = in_stack_fffffffffffff9a0;
  }
  TVar6 = ParserBase::expect(in_stack_fffffffffffffa30,kind_00);
  pIVar12 = in_RDI + 0xe;
  elements_01._M_ptr._4_2_ = in_stack_fffffffffffff9ac;
  elements_01._M_ptr._0_4_ = in_stack_fffffffffffff9a8;
  elements_01._M_ptr._6_2_ = in_stack_fffffffffffff9ae;
  elements_01._M_extent._M_extent_value = (size_t)local_210;
  slang::syntax::SeparatedSyntaxList<slang::syntax::NameSyntax>::SeparatedSyntaxList
            ((SeparatedSyntaxList<slang::syntax::NameSyntax> *)local_1d0,elements_01);
  local_320 = TVar6._0_8_;
  local_318 = (SourceLocation)TVar6.info;
  uVar9 = (undefined2)((ulong)local_78 >> 0x20);
  kind = (TokenKind)((ulong)local_78 >> 0x30);
  uVar10 = SUB84(local_198,0);
  uVar11 = (undefined4)((ulong)local_198 >> 0x20);
  openParen_01.info = in_stack_fffffffffffff9e0;
  openParen_01.kind = (short)in_stack_fffffffffffff9d8;
  openParen_01._2_1_ = (char)((ulong)in_stack_fffffffffffff9d8 >> 0x10);
  openParen_01.numFlags.raw = (char)((ulong)in_stack_fffffffffffff9d8 >> 0x18);
  openParen_01.rawLen = (int)((ulong)in_stack_fffffffffffff9d8 >> 0x20);
  edgeIdentifier.info._0_4_ = in_stack_fffffffffffff9d0;
  edgeIdentifier._0_8_ = local_318;
  edgeIdentifier.info._4_4_ = in_stack_fffffffffffff9d4;
  polarityOperator_00.info._0_7_ = in_stack_fffffffffffff9f8;
  polarityOperator_00._0_8_ = in_stack_fffffffffffff9f0;
  polarityOperator_00.info._7_1_ = in_stack_fffffffffffff9ff;
  pathOperator.info = (Info *)in_stack_fffffffffffffa08;
  pathOperator._0_8_ = pIVar12;
  closeParen_02.rawLen._2_2_ = in_stack_fffffffffffffa1e;
  closeParen_02._0_6_ = in_stack_fffffffffffffa18;
  closeParen_02.info = in_RDI;
  this_01 = (Token *)local_68.info;
  this_03._M_extent_value = (size_t)local_70;
  uVar7 = local_68.rawLen;
  pPVar3 = slang::syntax::SyntaxFactory::pathDescription
                     ((SyntaxFactory *)local_320,openParen_01,edgeIdentifier,
                      (SeparatedSyntaxList<slang::syntax::NameSyntax> *)local_198,
                      polarityOperator_00,pathOperator,(PathSuffixSyntax *)suffix_00,closeParen_02);
  ParserBase::expect(in_stack_fffffffffffffa30,kind_00);
  Token::Token(this_01);
  Token::Token(this_01);
  Token::Token(this_01);
  uVar8 = (undefined4)((ulong)this_01 >> 0x20);
  std::span<slang::syntax::TokenOrSyntax,_18446744073709551615UL>::span
            ((span<slang::syntax::TokenOrSyntax,_18446744073709551615UL> *)0x31e0f0);
  bVar1 = ParserBase::peek((ParserBase *)this_03._M_extent_value,kind);
  if (bVar1) {
    this_00 = (ConstTokenOrSyntax *)&stack0xfffffffffffffc00;
    this_03._M_extent_value = (size_t)&stack0xfffffffffffffbe0;
    this_02 = (SeparatedSyntaxList<slang::syntax::ExpressionSyntax> *)CONCAT44(uVar8,1);
    uVar8 = 0x10001;
    uVar10 = 0;
    ParserBase::
    parseList<&slang::syntax::SyntaxFacts::isPossibleExpressionOrComma,&slang::syntax::SyntaxFacts::isEndOfParenList,slang::parsing::Parser::parsePathDeclaration()::__2>
              ((ParserBase *)CONCAT44(0x10001,in_stack_fffffffffffffbe8),
               (TokenKind)((ulong)in_RDI >> 0x30),(TokenKind)((ulong)in_RDI >> 0x20),
               (TokenKind)((ulong)in_RDI >> 0x10),in_stack_fffffffffffffbd0._8_8_,
               in_stack_fffffffffffffbd0._0_8_,(Token *)in_stack_fffffffffffffc00,
               in_stack_fffffffffffffc08,in_stack_fffffffffffffc10,in_stack_fffffffffffffc18,
               (AllowEmpty)in_stack_fffffffffffffc20);
    TVar6 = ParserBase::expect(in_stack_fffffffffffffa30,kind_00);
    in_stack_fffffffffffffc20 = TVar6._0_8_;
    local_3d8 = TVar6.info;
  }
  else {
    in_stack_fffffffffffff9f8 = SUB87(local_4b8 + 0x10,0);
    in_stack_fffffffffffff9ff = (undefined1)((ulong)(local_4b8 + 0x10) >> 0x38);
    SmallVector<slang::syntax::TokenOrSyntax,_4UL>::SmallVector
              ((SmallVector<slang::syntax::TokenOrSyntax,_4UL> *)0x31e1dd);
    local_4b8._12_4_ = 0x10001;
    this_02 = (SeparatedSyntaxList<slang::syntax::ExpressionSyntax> *)local_4b8;
    this_00 = (ConstTokenOrSyntax *)CONCAT44(uVar7,0x10001);
    uVar8 = 0;
    ParserBase::
    parseList<&slang::syntax::SyntaxFacts::isPossibleExpressionOrComma,&slang::syntax::SyntaxFacts::isSemicolon,slang::parsing::Parser::parsePathDeclaration()::__3>
              (in_stack_fffffffffffffad0,in_stack_fffffffffffffac8,in_stack_fffffffffffffac6,
               in_stack_fffffffffffffac4,in_stack_fffffffffffffab8,in_stack_fffffffffffffab4,
               in_stack_fffffffffffffae0,in_stack_fffffffffffffae8,in_stack_fffffffffffffaf0);
    iVar2 = SmallVectorBase<slang::syntax::TokenOrSyntax>::copy
                      ((SmallVectorBase<slang::syntax::TokenOrSyntax> *)(local_4b8 + 0x10),
                       (EVP_PKEY_CTX *)in_RDI->rawTextPtr,src);
    in_stack_fffffffffffff9f0 = (SyntaxNode *)CONCAT44(extraout_var,iVar2);
    in_stack_fffffffffffff9e8 = extraout_RDX;
    SmallVector<slang::syntax::TokenOrSyntax,_4UL>::~SmallVector
              ((SmallVector<slang::syntax::TokenOrSyntax,_4UL> *)0x31e2a6);
  }
  sVar4 = std::span<slang::syntax::TokenOrSyntax,_18446744073709551615UL>::size
                    ((span<slang::syntax::TokenOrSyntax,_18446744073709551615UL> *)0x31e2db);
  if ((((sVar4 != 0) &&
       (sVar4 = std::span<slang::syntax::TokenOrSyntax,_18446744073709551615UL>::size
                          ((span<slang::syntax::TokenOrSyntax,_18446744073709551615UL> *)0x31e2f2),
       sVar4 != 1)) &&
      (sVar4 = std::span<slang::syntax::TokenOrSyntax,_18446744073709551615UL>::size
                         ((span<slang::syntax::TokenOrSyntax,_18446744073709551615UL> *)0x31e309),
      sVar4 != 3)) &&
     (((sVar4 = std::span<slang::syntax::TokenOrSyntax,_18446744073709551615UL>::size
                          ((span<slang::syntax::TokenOrSyntax,_18446744073709551615UL> *)0x31e320),
       sVar4 != 5 &&
       (sVar4 = std::span<slang::syntax::TokenOrSyntax,_18446744073709551615UL>::size
                          ((span<slang::syntax::TokenOrSyntax,_18446744073709551615UL> *)0x31e337),
       sVar4 != 0xb)) &&
      (sVar4 = std::span<slang::syntax::TokenOrSyntax,_18446744073709551615UL>::size
                         ((span<slang::syntax::TokenOrSyntax,_18446744073709551615UL> *)0x31e34e),
      sVar4 != 0x17)))) {
    std::span<slang::syntax::TokenOrSyntax,_18446744073709551615UL>::back
              ((span<slang::syntax::TokenOrSyntax,_18446744073709551615UL> *)this_02);
    bVar1 = slang::syntax::ConstTokenOrSyntax::isNode((ConstTokenOrSyntax *)0x31e37a);
    if (bVar1) {
      slang::syntax::TokenOrSyntax::node((TokenOrSyntax *)0x31e38d);
      slang::syntax::SyntaxNode::sourceRange(in_stack_fffffffffffff9f0);
    }
    else {
      slang::syntax::ConstTokenOrSyntax::token(this_00);
      Token::range((Token *)local_320);
    }
    range_00.endLoc = local_318;
    range_00.startLoc = local_320;
    ParserBase::addDiag((ParserBase *)CONCAT44(uVar11,uVar10),in_stack_fffffffffffff9d4,range_00);
  }
  slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>::SyntaxList
            ((SyntaxList<slang::syntax::AttributeInstanceSyntax> *)this_03._M_extent_value,
             (nullptr_t)CONCAT26(kind,CONCAT24(uVar9,uVar8)));
  elements_02._M_ptr._4_2_ = uVar9;
  elements_02._M_ptr._0_4_ = uVar8;
  elements_02._M_ptr._6_2_ = kind;
  elements_02._M_extent._M_extent_value = this_03._M_extent_value;
  slang::syntax::SeparatedSyntaxList<slang::syntax::ExpressionSyntax>::SeparatedSyntaxList
            (this_02,elements_02);
  equals_00.info._0_4_ = in_stack_fffffffffffff9d0;
  equals_00._0_8_ = local_318;
  equals_00.info._4_4_ = in_stack_fffffffffffff9d4;
  openParen_02.info = in_stack_fffffffffffff9e8;
  openParen_02._0_8_ = pPVar3;
  closeParen_00.info._0_7_ = in_stack_fffffffffffff9f8;
  closeParen_00._0_8_ = in_stack_fffffffffffff9f0;
  closeParen_00.info._7_1_ = in_stack_fffffffffffff9ff;
  semi_00.info = (Info *)in_stack_fffffffffffffa08;
  semi_00._0_8_ = pIVar12;
  pPVar5 = slang::syntax::SyntaxFactory::pathDeclaration
                     ((SyntaxFactory *)local_3d8,in_stack_fffffffffffffc20,
                      (PathDescriptionSyntax *)CONCAT44(uStack_3f4,in_stack_fffffffffffffc08),
                      equals_00,openParen_02,
                      (SeparatedSyntaxList<slang::syntax::ExpressionSyntax> *)
                      in_stack_fffffffffffffc00,closeParen_00,semi_00);
  return pPVar5;
}

Assistant:

PathDeclarationSyntax& Parser::parsePathDeclaration() {
    auto parsePolarity = [&] {
        switch (peek().kind) {
            case TokenKind::Plus:
            case TokenKind::Minus:
                return consume();
            default:
                return Token();
        }
    };

    auto checkTerminals = [&](std::span<TokenOrSyntax> terminals, bool isFull) {
        if (!isFull && terminals.size() > 2) {
            Token first = terminals[2].node()->getFirstToken();
            Token last = terminals.back().node()->getLastToken();
            addDiag(diag::MultipleParallelTerminals,
                    SourceRange{first.location(), last.location() + last.rawText().length()});
        }
    };

    auto openParen = expect(TokenKind::OpenParenthesis);
    auto edge = parseEdgeKeyword();
    auto inputs = parsePathTerminals();
    auto polarity = parsePolarity();

    // In specify blocks, +=> (and -=>) should be parsed as '+' and '=>',
    // but of course the lexer tokenizes it as '+=' and '>' so we need to
    // work around that here.
    Token op;
    bool isFull = false;
    if (!polarity && (peek(TokenKind::PlusEqual) || peek(TokenKind::MinusEqual))) {
        polarity = consume();
        op = consumeIf(TokenKind::GreaterThan);
        if (!op) {
            addDiag(diag::ExpectedPathOp, polarity.location() + 1);
            op = missingToken(TokenKind::GreaterThan, peek().location());
        }
        else if (!op.trivia().empty()) {
            addDiag(diag::ExpectedPathOp, polarity.location() + 1);
        }
    }
    else {
        switch (peek().kind) {
            case TokenKind::StarArrow:
                isFull = true;
                op = consume();
                break;
            case TokenKind::EqualsArrow:
                op = consume();
                break;
            default:
                addDiag(diag::ExpectedPathOp, peek().location());
                op = missingToken(TokenKind::EqualsArrow, peek().location());
                break;
        }
    }

    checkTerminals(inputs, isFull);

    PathSuffixSyntax* suffix;
    if (peek(TokenKind::OpenParenthesis)) {
        auto suffixOpenParen = consume();
        auto outputs = parsePathTerminals();
        auto polarity2 = parsePolarity();

        // The polarity we just tried to parse could have been a '+' or a '-' next
        // to the expected colon, which would get lexed together as a single token.
        // In that case don't bother trying to find another colon token.
        Token colon;
        if (!polarity2 && (peek(TokenKind::PlusColon) || peek(TokenKind::MinusColon)))
            polarity2 = consume();
        else
            colon = expect(TokenKind::Colon);

        auto& expr = parseExpression();
        auto suffixCloseParen = expect(TokenKind::CloseParenthesis);
        suffix = &factory.edgeSensitivePathSuffix(suffixOpenParen, outputs, polarity2, colon, expr,
                                                  suffixCloseParen);

        checkTerminals(outputs, isFull);
    }
    else {
        auto outputs = parsePathTerminals();
        suffix = &factory.simplePathSuffix(outputs);
        checkTerminals(outputs, isFull);
    }

    auto closeParen = expect(TokenKind::CloseParenthesis);
    auto& desc = factory.pathDescription(openParen, edge, inputs, polarity, op, *suffix,
                                         closeParen);

    auto equals = expect(TokenKind::Equals);

    Token semi;
    Token valueOpenParen, valueCloseParen;
    std::span<TokenOrSyntax> delays;

    if (peek(TokenKind::OpenParenthesis)) {
        parseList<isPossibleExpressionOrComma, isEndOfParenList>(
            TokenKind::OpenParenthesis, TokenKind::CloseParenthesis, TokenKind::Comma,
            valueOpenParen, delays, valueCloseParen, RequireItems::True, diag::ExpectedExpression,
            [this] { return &parseMinTypMaxExpression(); });
        semi = expect(TokenKind::Semicolon);
    }
    else {
        SmallVector<TokenOrSyntax, 4> buffer;
        parseList<isPossibleExpressionOrComma, isSemicolon>(
            buffer, TokenKind::Semicolon, TokenKind::Comma, semi, RequireItems::True,
            diag::ExpectedExpression, [this] { return &parseMinTypMaxExpression(); });
        delays = buffer.copy(alloc);
    }

    if (delays.size() > 0 && delays.size() != 1 && delays.size() != 3 && delays.size() != 5 &&
        delays.size() != 11 && delays.size() != 23) {
        auto& lastDelay = delays.back();
        auto range = lastDelay.isNode() ? lastDelay.node()->sourceRange()
                                        : lastDelay.token().range();
        addDiag(diag::WrongSpecifyDelayCount, range);
    }

    return factory.pathDeclaration(nullptr, desc, equals, valueOpenParen, delays, valueCloseParen,
                                   semi);
}